

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall BasicBlock::DumpHeader(BasicBlock *this,bool insertCR)

{
  ushort uVar1;
  uint32 uVar2;
  uint uVar3;
  Loop *this_00;
  code *pcVar4;
  bool bVar5;
  ImplicitCallFlags flags;
  undefined4 *puVar6;
  Type *ppFVar7;
  BasicBlock *pBVar8;
  char16 *form;
  undefined7 in_register_00000031;
  char16_t *pcVar9;
  Loop *pLVar10;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar11;
  bool bVar12;
  Iterator local_40;
  
  if ((int)CONCAT71(in_register_00000031,insertCR) != 0) {
    Output::Print(L"\n");
  }
  Output::Print(L"BLOCK %d:",(ulong)this->number);
  uVar1 = *(ushort *)&this->field_0x18;
  if ((uVar1 & 2) != 0) {
    Output::Print(L" **** DEAD ****");
    uVar1 = *(ushort *)&this->field_0x18;
  }
  if ((uVar1 >> 8 & 1) == 0) {
    if ((uVar1 >> 9 & 1) != 0) {
      pcVar9 = L" **** Air lock Block ****";
      goto LAB_003f7b35;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      pcVar9 = L" **** Break Source Compensation Code ****";
      goto LAB_003f7b35;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      pcVar9 = L" **** Break Sink Compensation Code ****";
      goto LAB_003f7b35;
    }
    if ((uVar1 & 0x40) != 0) {
      pcVar9 = L" **** Airlock block Compensation Code ****";
      goto LAB_003f7b35;
    }
  }
  else {
    pcVar9 = L" **** Break Block ****";
LAB_003f7b35:
    Output::Print(pcVar9);
  }
  pSVar11 = &(this->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar11) {
    bVar12 = false;
    Output::Print(L" In(");
    local_40.list = pSVar11;
    local_40.current = &pSVar11->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pSVar11 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_003f8127;
        *puVar6 = 0;
        pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
      pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 &pSVar11->super_SListNodeBase<Memory::ArenaAllocator>)->
                super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pSVar11 == local_40.list) break;
      local_40.current = (NodeBase *)pSVar11;
      ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
      pBVar8 = (*ppFVar7)->predBlock;
      if (pBVar8 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0xfe1,"(blockPred)","blockPred");
        if (!bVar5) goto LAB_003f8127;
        *puVar6 = 0;
      }
      if (bVar12) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",(ulong)pBVar8->number);
      bVar12 = true;
      pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
    }
    Output::Print(L")");
  }
  pSVar11 = &(this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar11) {
    bVar12 = false;
    Output::Print(L" Out(");
    local_40.list = pSVar11;
    local_40.current = &pSVar11->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pSVar11 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_003f8127;
        *puVar6 = 0;
        pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
      pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 &pSVar11->super_SListNodeBase<Memory::ArenaAllocator>)->
                super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pSVar11 == local_40.list) break;
      local_40.current = (NodeBase *)pSVar11;
      ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
      pBVar8 = (*ppFVar7)->succBlock;
      if (pBVar8 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0xff3,"(blockSucc)","blockSucc");
        if (!bVar5) goto LAB_003f8127;
        *puVar6 = 0;
      }
      if (bVar12) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",(ulong)pBVar8->number);
      bVar12 = true;
      pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
    }
    Output::Print(L")");
  }
  pSVar11 = &(this->deadPredList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->deadPredList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar11) {
    bVar12 = false;
    Output::Print(L" DeadIn(");
    local_40.list = pSVar11;
    local_40.current = &pSVar11->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (pSVar11 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_003f8127;
        *puVar6 = 0;
        pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
      pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 &pSVar11->super_SListNodeBase<Memory::ArenaAllocator>)->
                super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pSVar11 == local_40.list) break;
      local_40.current = (NodeBase *)pSVar11;
      ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
      pBVar8 = (*ppFVar7)->predBlock;
      if (pBVar8 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x1004,"(blockPred)","blockPred");
        if (!bVar5) goto LAB_003f8127;
        *puVar6 = 0;
      }
      if (bVar12) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",(ulong)pBVar8->number);
      bVar12 = true;
      pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
    }
    Output::Print(L")");
  }
  pSVar11 = &(this->deadSuccList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->deadSuccList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_SListNodeBase<Memory::ArenaAllocator>.next != pSVar11) {
    bVar12 = false;
    Output::Print(L" DeadOut(");
    local_40.list = pSVar11;
    local_40.current = &pSVar11->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    do {
      if (pSVar11 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) {
LAB_003f8127:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar6 = 0;
        pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
      pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 &pSVar11->super_SListNodeBase<Memory::ArenaAllocator>)->
                super_SListNodeBase<Memory::ArenaAllocator>).next;
      if (pSVar11 == local_40.list) goto LAB_003f8024;
      local_40.current = (NodeBase *)pSVar11;
      ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
      pBVar8 = (*ppFVar7)->succBlock;
      if (pBVar8 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x1015,"(blockSucc)","blockSucc");
        if (!bVar5) goto LAB_003f8127;
        *puVar6 = 0;
      }
      if (bVar12) {
        Output::Print(L", ");
      }
      Output::Print(L"%d",(ulong)pBVar8->number);
      bVar12 = true;
      pSVar11 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
    } while( true );
  }
LAB_003f8036:
  pLVar10 = this->loop;
  if (pLVar10 != (Loop *)0x0) {
    uVar2 = pLVar10->loopNumber;
    pBVar8 = Loop::GetHeadBlock(pLVar10);
    Output::Print(L"   Loop(%d) header: %d",(ulong)(uVar2 - 1),(ulong)pBVar8->number);
    pLVar10 = this->loop;
    this_00 = pLVar10->parent;
    if (this_00 != (Loop *)0x0) {
      uVar3 = this_00->loopNumber;
      pBVar8 = Loop::GetHeadBlock(this_00);
      Output::Print(L" parent(%d): %d",(ulong)uVar3,(ulong)pBVar8->number);
      pLVar10 = this->loop;
    }
    pBVar8 = Loop::GetHeadBlock(pLVar10);
    if (pBVar8 == this) {
      Output::SkipToColumn(0x32);
      Output::Print(L"Call Exp/Imp: ");
      pcVar9 = L"yes/";
      if ((*(ushort *)&this->loop->field_0x178 & 8) == 0) {
        pcVar9 = L" no/";
      }
      Output::Print(pcVar9);
      flags = Loop::GetImplicitCallFlags(this->loop);
      form = Js::DynamicProfileInfo::GetImplicitCallFlagsString(flags);
      Output::Print(form);
    }
  }
  Output::Print(L"\n");
  if (insertCR) {
    Output::Print(L"\n");
  }
  return;
LAB_003f8024:
  Output::Print(L")");
  goto LAB_003f8036;
}

Assistant:

void
BasicBlock::DumpHeader(bool insertCR)
{
    if (insertCR)
    {
        Output::Print(_u("\n"));
    }
    Output::Print(_u("BLOCK %d:"), this->number);

    if (this->isDead)
    {
        Output::Print(_u(" **** DEAD ****"));
    }

    if (this->isBreakBlock)
    {
        Output::Print(_u(" **** Break Block ****"));
    }
    else if (this->isAirLockBlock)
    {
        Output::Print(_u(" **** Air lock Block ****"));
    }
    else if (this->isBreakCompensationBlockAtSource)
    {
        Output::Print(_u(" **** Break Source Compensation Code ****"));
    }
    else if (this->isBreakCompensationBlockAtSink)
    {
        Output::Print(_u(" **** Break Sink Compensation Code ****"));
    }
    else if (this->isAirLockCompensationBlock)
    {
        Output::Print(_u(" **** Airlock block Compensation Code ****"));
    }

    if (!this->predList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" In("));
        FOREACH_PREDECESSOR_BLOCK(blockPred, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockPred->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_PREDECESSOR_BLOCK;
        Output::Print(_u(")"));
    }


    if (!this->succList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" Out("));
        FOREACH_SUCCESSOR_BLOCK(blockSucc, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockSucc->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_SUCCESSOR_BLOCK;
        Output::Print(_u(")"));
    }

    if (!this->deadPredList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" DeadIn("));
        FOREACH_DEAD_PREDECESSOR_BLOCK(blockPred, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockPred->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_DEAD_PREDECESSOR_BLOCK;
        Output::Print(_u(")"));
    }

    if (!this->deadSuccList.Empty())
    {
        BOOL fFirst = TRUE;
        Output::Print(_u(" DeadOut("));
        FOREACH_DEAD_SUCCESSOR_BLOCK(blockSucc, this)
        {
            if (!fFirst)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("%d"), blockSucc->GetBlockNum());
            fFirst = FALSE;
        }
        NEXT_DEAD_SUCCESSOR_BLOCK;
        Output::Print(_u(")"));
    }

    if (this->loop)
    {
        Output::Print(_u("   Loop(%d) header: %d"), this->loop->loopNumber - 1, this->loop->GetHeadBlock()->GetBlockNum());

        if (this->loop->parent)
        {
            Output::Print(_u(" parent(%d): %d"), this->loop->parent->loopNumber, this->loop->parent->GetHeadBlock()->GetBlockNum());
        }

        if (this->loop->GetHeadBlock() == this)
        {
            Output::SkipToColumn(50);
            Output::Print(_u("Call Exp/Imp: "));
            if (this->loop->GetHasCall())
            {
                Output::Print(_u("yes/"));
            }
            else
            {
                Output::Print(_u(" no/"));
            }
            Output::Print(Js::DynamicProfileInfo::GetImplicitCallFlagsString(this->loop->GetImplicitCallFlags()));
        }
    }

    Output::Print(_u("\n"));
    if (insertCR)
    {
        Output::Print(_u("\n"));
    }
}